

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O1

int __thiscall NetQuantize::quantize_innerproduct(NetQuantize *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  key_type *pkVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  _Base_ptr p_Var4;
  int *piVar5;
  void *pvVar6;
  long *plVar7;
  ulong uVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  iterator iVar12;
  size_t sVar13;
  iterator iVar14;
  int unaff_R12D;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  Mat weight_data_int8;
  Mat weight_data_r2;
  Option opt_q;
  char key [256];
  key_type local_328;
  long *local_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined4 local_2f0;
  pointer local_2e8;
  undefined1 local_2d8 [40];
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  int local_2a0;
  size_t local_298;
  Option *local_290;
  _Base_ptr local_288;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *local_280;
  _Base_ptr local_278;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *local_270;
  Mat local_268;
  Mat local_218;
  Mat local_1c8;
  Option local_178;
  char local_138 [264];
  
  pvVar2 = (this->super_ModelWriter).layers;
  uVar15 = (uint)((ulong)((long)(pvVar2->
                                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar2->
                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar15) {
    local_270 = &this->blob_int8scale_table;
    local_278 = &(this->blob_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_280 = &this->weight_int8scale_table;
    local_288 = &(this->weight_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_290 = &(this->super_ModelWriter).super_Net.opt;
    uVar16 = 0;
    do {
      iVar10 = std::__cxx11::string::compare
                         ((char *)&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[uVar16]->type);
      iVar11 = unaff_R12D;
      if (iVar10 == 0) {
        iVar12 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                 ::find(&local_270->_M_t,
                        &(((this->super_ModelWriter).layers)->
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar16]->name);
        bVar9 = false;
        if (iVar12._M_node != local_278) {
          sprintf(local_138,"%s_param_0",
                  ((((this->super_ModelWriter).layers)->
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar16]->name)._M_dataplus._M_p);
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
          sVar13 = strlen(local_138);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_328,local_138,local_138 + sVar13);
          iVar14 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                   ::find(&local_280->_M_t,&local_328);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != &local_328.field_2) {
            operator_delete(local_328._M_dataplus._M_p);
          }
          if (iVar14._M_node == local_288) {
            quantize_innerproduct();
            iVar11 = -1;
            bVar9 = true;
          }
          else {
            pLVar3 = (((this->super_ModelWriter).layers)->
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar16];
            local_328._M_dataplus._M_p = *(pointer *)(iVar12._M_node + 2);
            p_Var4 = iVar12._M_node[2]._M_parent;
            local_328._M_string_length._0_4_ = SUB84(p_Var4,0);
            local_328._M_string_length._4_4_ = (undefined4)((ulong)p_Var4 >> 0x20);
            local_328.field_2._M_allocated_capacity._0_4_ = SUB84(iVar12._M_node[2]._M_left,0);
            local_328.field_2._M_allocated_capacity._4_4_ =
                 (undefined4)((ulong)iVar12._M_node[2]._M_left >> 0x20);
            local_328.field_2._8_4_ = *(undefined4 *)&iVar12._M_node[2]._M_right;
            local_308 = *(long **)(iVar12._M_node + 3);
            local_300 = iVar12._M_node[3]._M_parent;
            uStack_2f8 = iVar12._M_node[3]._M_left;
            local_2f0 = *(undefined4 *)&iVar12._M_node[3]._M_right;
            local_2e8 = *(pointer *)(iVar12._M_node + 4);
            if (p_Var4 != (_Base_ptr)0x0) {
              LOCK();
              p_Var4->_M_color = p_Var4->_M_color + _S_black;
              UNLOCK();
            }
            local_2d8._0_8_ = *(undefined8 *)(iVar14._M_node + 2);
            p_Var4 = iVar14._M_node[2]._M_parent;
            local_2d8._8_4_ = SUB84(p_Var4,0);
            local_2d8._12_4_ = (undefined4)((ulong)p_Var4 >> 0x20);
            local_2d8._16_4_ = SUB84(iVar14._M_node[2]._M_left,0);
            local_2d8._20_4_ = (undefined4)((ulong)iVar14._M_node[2]._M_left >> 0x20);
            local_2d8._24_4_ = *(undefined4 *)&iVar14._M_node[2]._M_right;
            local_2d8._32_8_ = *(undefined8 *)(iVar14._M_node + 3);
            local_2b0 = iVar14._M_node[3]._M_parent;
            uStack_2a8 = iVar14._M_node[3]._M_left;
            local_2a0 = *(int *)&iVar14._M_node[3]._M_right;
            local_298 = *(size_t *)(iVar14._M_node + 4);
            if (p_Var4 != (_Base_ptr)0x0) {
              LOCK();
              p_Var4->_M_color = p_Var4->_M_color + _S_black;
              UNLOCK();
            }
            fprintf(_stderr,"quantize_innerproduct %s\n",(pLVar3->name)._M_dataplus._M_p);
            this_00 = &pLVar3[1].name.field_2;
            ncnn::Mat::reshape(&local_1c8,(Mat *)this_00,
                               *(int *)&pLVar3[1].one_blob_only / *(int *)&pLVar3[1]._vptr_Layer,
                               *(int *)&pLVar3[1]._vptr_Layer,(Allocator *)0x0);
            local_218.cstep = 0;
            local_218.data = (void *)0x0;
            local_218.refcount._0_4_ = 0;
            local_218.refcount._4_4_ = 0;
            local_218.elemsize._0_4_ = 0;
            local_218._20_8_ = 0;
            local_218.h = 0;
            local_218.d = 0;
            local_218.c = 0;
            local_218.allocator = (Allocator *)0x0;
            local_218.dims = 0;
            local_218.w = 0;
            local_178.lightmode = local_290->lightmode;
            local_178._1_3_ = *(undefined3 *)&local_290->field_0x1;
            local_178.num_threads = local_290->num_threads;
            local_178.blob_allocator = local_290->blob_allocator;
            local_178.workspace_allocator = local_290->workspace_allocator;
            local_178.openmp_blocktime = local_290->openmp_blocktime;
            local_178.use_winograd_convolution = local_290->use_winograd_convolution;
            local_178.use_sgemm_convolution = local_290->use_sgemm_convolution;
            local_178.use_int8_inference = local_290->use_int8_inference;
            local_178.use_vulkan_compute = local_290->use_vulkan_compute;
            uVar8._0_1_ = local_290->use_bf16_storage;
            uVar8._1_1_ = local_290->use_fp16_packed;
            uVar8._2_1_ = local_290->use_fp16_storage;
            uVar8._3_1_ = local_290->use_fp16_arithmetic;
            uVar8._4_1_ = local_290->use_int8_packed;
            uVar8._5_1_ = local_290->use_int8_storage;
            uVar8._6_1_ = local_290->use_int8_arithmetic;
            uVar8._7_1_ = local_290->use_packing_layout;
            local_178.use_shader_pack8 = local_290->use_shader_pack8;
            local_178.use_subgroup_basic = local_290->use_subgroup_basic;
            local_178.use_subgroup_vote = local_290->use_subgroup_vote;
            local_178.use_subgroup_ballot = local_290->use_subgroup_ballot;
            local_178.use_subgroup_shuffle = local_290->use_subgroup_shuffle;
            local_178.use_image_storage = local_290->use_image_storage;
            local_178.use_tensor_storage = local_290->use_tensor_storage;
            local_178.use_weight_fp16_storage = local_290->use_weight_fp16_storage;
            local_178.flush_denormals = local_290->flush_denormals;
            local_178.use_local_pool_allocator = local_290->use_local_pool_allocator;
            local_178.use_reserved_1 = local_290->use_reserved_1;
            local_178.use_reserved_2 = local_290->use_reserved_2;
            local_178.use_reserved_3 = local_290->use_reserved_3;
            local_178.use_reserved_4 = local_290->use_reserved_4;
            local_178.use_reserved_5 = local_290->use_reserved_5;
            local_178.use_reserved_6 = local_290->use_reserved_6;
            local_178.use_reserved_7 = local_290->use_reserved_7;
            local_178.use_reserved_8 = local_290->use_reserved_8;
            local_178.use_reserved_9 = local_290->use_reserved_9;
            local_178.use_reserved_10 = local_290->use_reserved_10;
            local_178.use_reserved_11 = local_290->use_reserved_11;
            local_178._32_8_ = uVar8 & 0xffffffffffffff;
            ncnn::quantize_to_int8(&local_1c8,&local_218,(Mat *)local_2d8,&local_178);
            bVar17 = local_218.data != (void *)0x0;
            bVar18 = (long)local_218.c * local_218.cstep != 0;
            iVar11 = -100;
            if (bVar17 && bVar18) {
              iVar11._0_1_ = pLVar3[1].one_blob_only;
              iVar11._1_1_ = pLVar3[1].support_inplace;
              iVar11._2_1_ = pLVar3[1].support_vulkan;
              iVar11._3_1_ = pLVar3[1].support_packing;
              ncnn::Mat::reshape(&local_268,&local_218,iVar11,(Allocator *)0x0);
              if ((Mat *)this_00 != &local_268) {
                piVar5 = (int *)CONCAT44(local_268.refcount._4_4_,local_268.refcount._0_4_);
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + 1;
                  UNLOCK();
                }
                piVar5 = *(int **)((long)&pLVar3[1].name.field_2 + 8);
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + -1;
                  UNLOCK();
                  if (*piVar5 == 0) {
                    pvVar6 = (void *)pLVar3[1].name.field_2._M_allocated_capacity;
                    plVar7 = (long *)pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    if (plVar7 == (long *)0x0) {
                      if (pvVar6 != (void *)0x0) {
                        free(pvVar6);
                      }
                    }
                    else {
                      (**(code **)(*plVar7 + 0x18))();
                    }
                  }
                }
                pLVar3[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_start = 0;
                *(undefined8 *)((long)&pLVar3[1].name.field_2 + 0xc) = 0;
                *(undefined8 *)
                 ((long)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + 4) = 0;
                this_00->_M_allocated_capacity = 0;
                *(undefined8 *)((long)&pLVar3[1].name.field_2 + 8) = 0;
                pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = 0;
                pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                *(undefined4 *)
                 &pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = 0;
                pLVar3[1].name.field_2._M_allocated_capacity = (size_type)local_268.data;
                *(ulong *)((long)&pLVar3[1].name.field_2 + 8) =
                     CONCAT44(local_268.refcount._4_4_,local_268.refcount._0_4_);
                *(ulong *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data =
                     CONCAT44(local_268.elemsize._4_4_,(undefined4)local_268.elemsize);
                *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish = local_268.elempack;
                pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)local_268.allocator;
                *(int *)&pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data = local_268.dims;
                *(int *)((long)&pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data._M_start + 4) = local_268.w;
                *(int *)&pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish = local_268.h;
                *(int *)((long)&pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data._M_finish + 4) = local_268.d;
                *(int *)&pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage = local_268.c;
                *(size_t *)
                 &pLVar3[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data = local_268.cstep;
              }
              piVar5 = (int *)CONCAT44(local_268.refcount._4_4_,local_268.refcount._0_4_);
              if (piVar5 != (int *)0x0) {
                LOCK();
                *piVar5 = *piVar5 + -1;
                UNLOCK();
                if (*piVar5 == 0) {
                  if (local_268.allocator == (Allocator *)0x0) {
                    if (local_268.data != (void *)0x0) {
                      free(local_268.data);
                    }
                  }
                  else {
                    (*(local_268.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_268.cstep = 0;
              local_268.data = (void *)0x0;
              local_268.refcount._0_4_ = 0;
              local_268.refcount._4_4_ = 0;
              local_268.elemsize._0_4_ = 0;
              local_268.elemsize._4_4_ = 0;
              local_268.elempack = 0;
              local_268.dims = 0;
              local_268.w = 0;
              local_268.h = 0;
              local_268.d = 0;
              local_268.c = 0;
              iVar11 = unaff_R12D;
            }
            piVar5 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                if (local_218.allocator == (Allocator *)0x0) {
                  if (local_218.data != (void *)0x0) {
                    free(local_218.data);
                  }
                }
                else {
                  (*(local_218.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_218.cstep = 0;
            local_218.data = (void *)0x0;
            local_218.refcount._0_4_ = 0;
            local_218.refcount._4_4_ = 0;
            local_218.elemsize._0_4_ = 0;
            local_218._20_8_ = 0;
            local_218.dims = 0;
            local_218.w = 0;
            local_218.h = 0;
            local_218.d = 0;
            local_218.c = 0;
            piVar5 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                if (local_1c8.allocator == (Allocator *)0x0) {
                  if (local_1c8.data != (void *)0x0) {
                    free(local_1c8.data);
                  }
                }
                else {
                  (*(local_1c8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_1c8.cstep = 0;
            local_1c8.data = (void *)0x0;
            local_1c8.refcount._0_4_ = 0;
            local_1c8.refcount._4_4_ = 0;
            local_1c8.elemsize._0_4_ = 0;
            local_1c8._20_8_ = 0;
            local_1c8.dims = 0;
            local_1c8.w = 0;
            local_1c8.h = 0;
            local_1c8.d = 0;
            local_1c8.c = 0;
            bVar9 = true;
            if (bVar17 && bVar18) {
              pLVar3[1].support_bf16_storage = true;
              pLVar3[1].support_fp16_storage = false;
              pLVar3[1].support_int8_storage = false;
              pLVar3[1].support_image_storage = false;
              if (&pLVar3[2].userdata != (void **)local_2d8) {
                piVar5 = (int *)CONCAT44(local_2d8._12_4_,local_2d8._8_4_);
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + 1;
                  UNLOCK();
                }
                piVar5 = *(int **)&pLVar3[2].typeindex;
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + -1;
                  UNLOCK();
                  if (*piVar5 == 0) {
                    plVar7 = (long *)pLVar3[2].type.field_2._M_allocated_capacity;
                    if (plVar7 == (long *)0x0) {
                      if (pLVar3[2].userdata != (void *)0x0) {
                        free(pLVar3[2].userdata);
                      }
                    }
                    else {
                      (**(code **)(*plVar7 + 0x18))();
                    }
                  }
                }
                pLVar3[2].name.field_2._M_allocated_capacity = 0;
                *(undefined8 *)&pLVar3[2].field_0x2c = 0;
                *(undefined8 *)((long)&pLVar3[2].type._M_dataplus._M_p + 4) = 0;
                pLVar3[2].userdata = (void *)0x0;
                *(undefined8 *)&pLVar3[2].typeindex = 0;
                *(undefined8 *)((long)&pLVar3[2].type.field_2 + 8) = 0;
                pLVar3[2].name._M_dataplus._M_p = (pointer)0x0;
                *(undefined4 *)&pLVar3[2].name._M_string_length = 0;
                pLVar3[2].userdata = (void *)local_2d8._0_8_;
                *(ulong *)&pLVar3[2].typeindex = CONCAT44(local_2d8._12_4_,local_2d8._8_4_);
                pLVar3[2].type._M_dataplus._M_p =
                     (pointer)CONCAT44(local_2d8._20_4_,local_2d8._16_4_);
                *(undefined4 *)&pLVar3[2].type._M_string_length = local_2d8._24_4_;
                pLVar3[2].type.field_2._M_allocated_capacity = local_2d8._32_8_;
                *(int *)((long)&pLVar3[2].type.field_2 + 8) = (int)local_2b0;
                *(int *)((long)&pLVar3[2].type.field_2 + 0xc) = local_2b0._4_4_;
                *(int *)&pLVar3[2].name._M_dataplus._M_p = (int)uStack_2a8;
                *(int *)((long)&pLVar3[2].name._M_dataplus._M_p + 4) = uStack_2a8._4_4_;
                *(int *)&pLVar3[2].name._M_string_length = local_2a0;
                pLVar3[2].name.field_2._M_allocated_capacity = local_298;
              }
              pkVar1 = (key_type *)((long)&pLVar3[2].name.field_2 + 8);
              bVar9 = false;
              if (pkVar1 != &local_328) {
                piVar5 = (int *)CONCAT44(local_328._M_string_length._4_4_,
                                         (undefined4)local_328._M_string_length);
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + 1;
                  UNLOCK();
                }
                piVar5 = pLVar3[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + -1;
                  UNLOCK();
                  if (*piVar5 == 0) {
                    pvVar6 = *(void **)((long)&pLVar3[2].name.field_2 + 8);
                    plVar7 = *(long **)&pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>
                                        ._M_impl.super__Vector_impl_data;
                    if (plVar7 == (long *)0x0) {
                      if (pvVar6 != (void *)0x0) {
                        free(pvVar6);
                      }
                    }
                    else {
                      (**(code **)(*plVar7 + 0x18))();
                    }
                  }
                }
                pLVar3[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                *(undefined8 *)
                 ((long)&pLVar3[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + 4) = 0;
                *(undefined8 *)
                 ((long)&pLVar3[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 4) = 0;
                (pkVar1->_M_dataplus)._M_p = (pointer)0x0;
                pLVar3[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = 0;
                pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                *(undefined4 *)
                 &pLVar3[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data = 0;
                *(pointer *)((long)&pLVar3[2].name.field_2 + 8) = local_328._M_dataplus._M_p;
                *(ulong *)&pLVar3[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data =
                     CONCAT44(local_328._M_string_length._4_4_,
                              (undefined4)local_328._M_string_length);
                pLVar3[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     (pointer)CONCAT44(local_328.field_2._M_allocated_capacity._4_4_,
                                       local_328.field_2._M_allocated_capacity._0_4_);
                *(undefined4 *)
                 &pLVar3[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = local_328.field_2._8_4_;
                *(long **)&pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data = local_308;
                *(undefined4 *)
                 &pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (undefined4)local_300;
                *(undefined4 *)
                 ((long)&pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 4) = local_300._4_4_;
                *(undefined4 *)
                 &pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (undefined4)uStack_2f8;
                *(undefined4 *)
                 ((long)&pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4) = uStack_2f8._4_4_;
                *(undefined4 *)
                 &pLVar3[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data = local_2f0;
                pLVar3[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_finish = local_2e8;
              }
            }
            piVar5 = (int *)CONCAT44(local_2d8._12_4_,local_2d8._8_4_);
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                if ((Allocator *)local_2d8._32_8_ == (Allocator *)0x0) {
                  if ((void *)local_2d8._0_8_ != (void *)0x0) {
                    free((void *)local_2d8._0_8_);
                  }
                }
                else {
                  (*(*(_func_int ***)local_2d8._32_8_)[3])();
                }
              }
            }
            local_298 = 0;
            local_2d8._0_8_ = (void *)0x0;
            local_2d8._8_4_ = 0;
            local_2d8._12_4_ = 0;
            local_2d8._16_4_ = 0;
            local_2d8._20_4_ = 0;
            local_2d8._24_4_ = 0;
            local_2b0._0_4_ = 0;
            local_2b0._4_4_ = 0;
            uStack_2a8._0_4_ = 0;
            uStack_2a8._4_4_ = 0;
            local_2a0 = 0;
            piVar5 = (int *)CONCAT44(local_328._M_string_length._4_4_,
                                     (undefined4)local_328._M_string_length);
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                if (local_308 == (long *)0x0) {
                  if (local_328._M_dataplus._M_p != (pointer)0x0) {
                    free(local_328._M_dataplus._M_p);
                  }
                }
                else {
                  (**(code **)(*local_308 + 0x18))();
                }
              }
            }
            local_2e8 = (pointer)0x0;
            local_328._M_dataplus._M_p = (pointer)0x0;
            local_328._M_string_length._0_4_ = 0;
            local_328._M_string_length._4_4_ = 0;
            local_328.field_2._M_allocated_capacity._0_4_ = 0;
            local_328.field_2._M_allocated_capacity._4_4_ = 0;
            local_328.field_2._8_4_ = 0;
            local_300 = (_Base_ptr)0x0;
            uStack_2f8 = (_Base_ptr)0x0;
            local_2f0 = 0;
          }
        }
        if (bVar9) {
          return iVar11;
        }
      }
      uVar16 = uVar16 + 1;
      unaff_R12D = iVar11;
    } while ((uVar15 & 0x7fffffff) != uVar16);
  }
  return 0;
}

Assistant:

int NetQuantize::quantize_innerproduct()
{
    const int layer_count = static_cast<int>(layers.size());
    for (int i = 0; i < layer_count; i++)
    {
        // find convolution layer
        if (layers[i]->type != "InnerProduct")
            continue;

        // find InnerProduct layer
        std::map<std::string, ncnn::Mat>::iterator iter_data = blob_int8scale_table.find(layers[i]->name);
        if (iter_data == blob_int8scale_table.end())
            continue;

        char key[256];
        sprintf(key, "%s_param_0", layers[i]->name.c_str());

        std::map<std::string, ncnn::Mat>::iterator iter = weight_int8scale_table.find(key);
        if (iter == weight_int8scale_table.end())
        {
            fprintf(stderr, "this layer need to be quantized, but no scale param!\n");
            return -1;
        }

        // InnerProduct - quantize weight from fp32 to int8
        ncnn::InnerProduct* fc = (ncnn::InnerProduct*)layers[i];

        ncnn::Mat bottom_blob_int8_scales = iter_data->second;
        ncnn::Mat weight_data_int8_scales = iter->second;

        fprintf(stderr, "quantize_innerproduct %s\n", fc->name.c_str());

        {
            const int num_input = fc->weight_data_size / fc->num_output;

            ncnn::Mat weight_data_r2 = fc->weight_data.reshape(num_input, fc->num_output);

            ncnn::Mat weight_data_int8;
            ncnn::Option opt_q = opt;
            opt_q.use_packing_layout = false;
            ncnn::quantize_to_int8(weight_data_r2, weight_data_int8, weight_data_int8_scales, opt_q);
            if (weight_data_int8.empty())
                return -100;

            fc->weight_data = weight_data_int8.reshape(fc->weight_data_size);
        }

        fc->int8_scale_term = 2;
        fc->weight_data_int8_scales = weight_data_int8_scales;
        fc->bottom_blob_int8_scales = bottom_blob_int8_scales;
    }

    return 0;
}